

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O2

int ON_JoinCurvesOld(ON_SimpleArray<const_ON_Curve_*> *InCurves,
                    ON_SimpleArray<ON_Curve_*> *OutCurves,double join_tol,bool bPreserveDirection,
                    ON_SimpleArray<int> *key)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  char cVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  OldCurveJoinEndData *pOVar9;
  void *__s;
  ON_SimpleArray<OldCurveJoinSeg> *pOVar10;
  OldCurveJoinSeg *pOVar11;
  OldCurveJoinSeg *pOVar12;
  int *piVar13;
  OldCurveJoinSeg this;
  ON_NurbsCurve *pOVar14;
  ON_PolyCurve *this_00;
  ON_Curve *pOVar15;
  undefined4 extraout_var_00;
  double *pdVar16;
  int si;
  size_t newcap;
  long lVar17;
  ON_SimpleArray<ON_Curve_*> *this_01;
  int iVar18;
  int j;
  ulong uVar19;
  ON_SimpleArray<int> *pOVar20;
  long lVar21;
  long lVar22;
  ON_SimpleArray<OldCurveJoinSeg> *this_02;
  ON_Interval OVar23;
  uint local_1a4;
  ON_SimpleArray<int> *local_1a0;
  void *local_198;
  ON_SimpleArray<OldCurveJoinSeg> *local_190;
  ON_Curve *C_1;
  int local_17c;
  OldCurveJoinSeg Seg;
  ON_SimpleArray<ON_Curve_*> IC;
  ON_SimpleArray<OldCurveJoinEndData> EData;
  ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_> SegsArray;
  ON_3dPointArray Start;
  ON_3dPointArray End;
  ON_SimpleArray<int> cmap;
  ON_3dPoint local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dPoint Q;
  ON_3dPoint local_48;
  
  iVar18 = 0;
  if (0 < InCurves->m_count) {
    iVar18 = OutCurves->m_count;
    iVar7 = (*((*InCurves->m_a)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
    for (lVar22 = 1; newcap = (size_t)InCurves->m_count, lVar22 < (long)newcap; lVar22 = lVar22 + 1)
    {
      iVar8 = (*(InCurves->m_a[lVar22]->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
      if (iVar8 != iVar7) {
        return 0;
      }
    }
    local_1a4 = (uint)lVar22;
    if (key != (ON_SimpleArray<int> *)0x0) {
      ON_SimpleArray<int>::Reserve(key,newcap);
      for (local_1a4 = 0; newcap = (size_t)InCurves->m_count, (int)local_1a4 < InCurves->m_count;
          local_1a4 = local_1a4 + 1) {
        IC._vptr_ON_SimpleArray._0_4_ = 0xffffffff;
        ON_SimpleArray<int>::Append(key,(int *)&IC);
      }
    }
    local_1a0 = key;
    ON_SimpleArray<ON_Curve_*>::Reserve(OutCurves,newcap);
    ON_SimpleArray<ON_Curve_*>::ON_SimpleArray(&IC,(long)InCurves->m_count);
    ON_SimpleArray<int>::ON_SimpleArray(&cmap,(long)InCurves->m_count);
    for (local_1a4 = 0; (int)local_1a4 < InCurves->m_count; local_1a4 = local_1a4 + 1) {
      iVar7 = (*(InCurves->m_a[(int)local_1a4]->super_ON_Geometry).super_ON_Object._vptr_ON_Object
                [0x24])();
      Start.super_ON_SimpleArray<ON_3dPoint>._vptr_ON_SimpleArray =
           (_func_int **)CONCAT44(extraout_var,iVar7);
      if (Start.super_ON_SimpleArray<ON_3dPoint>._vptr_ON_SimpleArray != (_func_int **)0x0) {
        cVar4 = (**(code **)(*Start.super_ON_SimpleArray<ON_3dPoint>._vptr_ON_SimpleArray + 0x1a0))
                          (Start.super_ON_SimpleArray<ON_3dPoint>._vptr_ON_SimpleArray);
        if (cVar4 == '\0') {
          ON_SimpleArray<int>::Append(&cmap,(int *)&local_1a4);
          this_01 = &IC;
        }
        else {
          this_01 = OutCurves;
          if (local_1a0 != (ON_SimpleArray<int> *)0x0) {
            local_1a0->m_a[(int)local_1a4] = OutCurves->m_count;
          }
        }
        ON_SimpleArray<ON_Curve_*>::Append(this_01,(ON_Curve **)&Start);
      }
    }
    ON_3dPointArray::ON_3dPointArray(&Start,IC.m_count);
    pOVar20 = local_1a0;
    if ((-1 < IC.m_count) && (IC.m_count <= Start.super_ON_SimpleArray<ON_3dPoint>.m_capacity)) {
      Start.super_ON_SimpleArray<ON_3dPoint>.m_count = IC.m_count;
    }
    ON_3dPointArray::ON_3dPointArray(&End,IC.m_count);
    if ((-1 < IC.m_count) && (IC.m_count <= End.super_ON_SimpleArray<ON_3dPoint>.m_capacity)) {
      End.super_ON_SimpleArray<ON_3dPoint>.m_count = IC.m_count;
    }
    for (local_1a4 = 0; (int)local_1a4 < IC.m_count; local_1a4 = local_1a4 + 1) {
      ON_Curve::PointAtStart((ON_3dPoint *)&EData,IC.m_a[(int)local_1a4]);
      lVar22 = (long)(int)local_1a4;
      Start.super_ON_SimpleArray<ON_3dPoint>.m_a[lVar22].z =
           (double)CONCAT44(EData.m_capacity,EData.m_count);
      Start.super_ON_SimpleArray<ON_3dPoint>.m_a[lVar22].x = (double)EData._vptr_ON_SimpleArray;
      Start.super_ON_SimpleArray<ON_3dPoint>.m_a[lVar22].y = (double)EData.m_a;
      ON_Curve::PointAtEnd((ON_3dPoint *)&EData,IC.m_a[lVar22]);
      End.super_ON_SimpleArray<ON_3dPoint>.m_a[(int)local_1a4].z =
           (double)CONCAT44(EData.m_capacity,EData.m_count);
      End.super_ON_SimpleArray<ON_3dPoint>.m_a[(int)local_1a4].x =
           (double)EData._vptr_ON_SimpleArray;
      End.super_ON_SimpleArray<ON_3dPoint>.m_a[(int)local_1a4].y = (double)EData.m_a;
    }
    ON_SimpleArray<OldCurveJoinEndData>::ON_SimpleArray(&EData,(long)IC.m_count);
    iVar7 = IC.m_count;
    for (local_1a4 = 0; (int)local_1a4 < iVar7; local_1a4 = local_1a4 + 1) {
      lVar22 = 0;
      for (uVar19 = 0; (long)uVar19 < (long)iVar7; uVar19 = uVar19 + 1) {
        if (uVar19 != local_1a4) {
          local_190 = (ON_SimpleArray<OldCurveJoinSeg> *)
                      ON_3dPoint::DistanceTo
                                (Start.super_ON_SimpleArray<ON_3dPoint>.m_a + (int)local_1a4,
                                 (ON_3dPoint *)
                                 ((long)&(End.super_ON_SimpleArray<ON_3dPoint>.m_a)->x + lVar22));
          iVar7 = (int)uVar19;
          if ((double)local_190 <= join_tol) {
            pOVar9 = ON_SimpleArray<OldCurveJoinEndData>::AppendNew(&EData);
            pOVar9->id[0] = local_1a4;
            pOVar9->end[0] = 0;
            pOVar9->end[1] = 1;
            pOVar9->id[1] = iVar7;
            pOVar9->dist = (double)local_190;
          }
          if ((!bPreserveDirection) && ((long)(int)local_1a4 < (long)uVar19)) {
            local_190 = (ON_SimpleArray<OldCurveJoinSeg> *)
                        ON_3dPoint::DistanceTo
                                  (Start.super_ON_SimpleArray<ON_3dPoint>.m_a + (int)local_1a4,
                                   (ON_3dPoint *)
                                   ((long)&(Start.super_ON_SimpleArray<ON_3dPoint>.m_a)->x + lVar22)
                                  );
            if ((double)local_190 <= join_tol) {
              pOVar9 = ON_SimpleArray<OldCurveJoinEndData>::AppendNew(&EData);
              pOVar9->id[0] = local_1a4;
              pOVar9->end[0] = 0;
              pOVar9->end[1] = 0;
              pOVar9->id[1] = iVar7;
              pOVar9->dist = (double)local_190;
            }
            local_190 = (ON_SimpleArray<OldCurveJoinSeg> *)
                        ON_3dPoint::DistanceTo
                                  (End.super_ON_SimpleArray<ON_3dPoint>.m_a + (int)local_1a4,
                                   (ON_3dPoint *)
                                   ((long)&(End.super_ON_SimpleArray<ON_3dPoint>.m_a)->x + lVar22));
            if ((double)local_190 <= join_tol) {
              pOVar9 = ON_SimpleArray<OldCurveJoinEndData>::AppendNew(&EData);
              pOVar9->id[0] = local_1a4;
              pOVar9->end[0] = 1;
              pOVar9->end[1] = 1;
              pOVar9->id[1] = iVar7;
              pOVar9->dist = (double)local_190;
            }
          }
        }
        lVar22 = lVar22 + 0x18;
        iVar7 = IC.m_count;
      }
      pOVar20 = local_1a0;
    }
    ON_SimpleArray<OldCurveJoinEndData>::QuickSort(&EData,OldCompareEndData);
    __s = onmalloc((long)IC.m_count << 3);
    lVar22 = 0;
    memset(__s,0,(long)IC.m_count << 3);
    local_198 = onmalloc((long)IC.m_count << 3);
    uVar19 = 0;
    if (0 < IC.m_count) {
      uVar19 = (ulong)(uint)IC.m_count;
    }
    for (; uVar19 * 8 - lVar22 != 0; lVar22 = lVar22 + 8) {
      *(long *)((long)local_198 + lVar22) = (long)__s + lVar22;
    }
    local_1a4 = (uint)uVar19;
    ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::ON_ClassArray(&SegsArray,(long)IC.m_count);
    for (local_1a4 = 0; pOVar10 = SegsArray.m_a, pvVar3 = local_198, (int)local_1a4 < EData.m_count;
        local_1a4 = local_1a4 + 1) {
      lVar22 = *(long *)((long)local_198 + (long)EData.m_a[(int)local_1a4].id[0] * 8);
      if (*(int *)(lVar22 + (long)EData.m_a[(int)local_1a4].end[0] * 4) < 1) {
        pOVar9 = EData.m_a + (int)local_1a4;
        iVar7 = pOVar9->id[1];
        lVar21 = *(long *)((long)local_198 + (long)iVar7 * 8);
        lVar17 = (long)pOVar9->end[1];
        if (*(int *)(lVar21 + lVar17 * 4) < 1) {
          iVar8 = *(int *)(lVar22 + (1 - (long)EData.m_a[(int)local_1a4].end[0]) * 4);
          lVar22 = (long)iVar8;
          iVar1 = *(int *)(lVar21 + (1 - lVar17) * 4);
          if (lVar22 == 0) {
            if (iVar1 == 0) {
              *(int *)(lVar21 + lVar17 * 4) = SegsArray.m_count + 1;
              *(int *)(*(long *)((long)local_198 + (long)pOVar9->id[0] * 8) +
                      (long)pOVar9->end[0] * 4) = SegsArray.m_count + 1;
              pOVar10 = ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::AppendNew(&SegsArray);
              ON_SimpleArray<OldCurveJoinSeg>::Reserve(pOVar10,4);
              pOVar11 = ON_SimpleArray<OldCurveJoinSeg>::AppendNew(pOVar10);
              pOVar20 = local_1a0;
              pOVar12 = ON_SimpleArray<OldCurveJoinSeg>::AppendNew(pOVar10);
              if (pOVar9->end[0] != 0) {
                pOVar11->id = pOVar9->id[0];
                pOVar11->bRev = false;
                goto LAB_0044eca2;
              }
              pOVar12->id = pOVar9->id[0];
              pOVar12->bRev = false;
              pOVar11->id = pOVar9->id[1];
              pOVar11->bRev = pOVar9->end[1] == 0;
            }
            else {
              *(int *)(lVar21 + lVar17 * 4) = iVar1;
              *(int *)(*(long *)((long)local_198 + (long)pOVar9->id[0] * 8) +
                      (long)pOVar9->end[0] * 4) = iVar1;
              if ((SegsArray.m_a[(long)iVar1 + -1].m_a)->id != pOVar9->id[1]) {
                pOVar12 = ON_SimpleArray<OldCurveJoinSeg>::AppendNew
                                    (SegsArray.m_a + (long)iVar1 + -1);
                pOVar12->id = pOVar9->id[0];
                iVar7 = pOVar9->end[0];
                pOVar20 = local_1a0;
                goto LAB_0044ecad;
              }
              Seg.bRev = pOVar9->end[0] == 0;
              Seg.id = pOVar9->id[0];
              ON_SimpleArray<OldCurveJoinSeg>::Insert(SegsArray.m_a + (long)iVar1 + -1,0,&Seg);
              pOVar20 = local_1a0;
            }
          }
          else if (iVar1 == 0) {
            *(int *)(lVar21 + lVar17 * 4) = iVar8;
            *(int *)(*(long *)((long)local_198 + (long)pOVar9->id[0] * 8) + (long)pOVar9->end[0] * 4
                    ) = iVar8;
            if ((SegsArray.m_a[lVar22 + -1].m_a)->id == pOVar9->id[0]) {
              Seg.bRev = pOVar9->end[1] == 0;
              Seg.id = pOVar9->id[1];
              ON_SimpleArray<OldCurveJoinSeg>::Insert(SegsArray.m_a + lVar22 + -1,0,&Seg);
              pOVar20 = local_1a0;
            }
            else {
              pOVar12 = ON_SimpleArray<OldCurveJoinSeg>::AppendNew(SegsArray.m_a + lVar22 + -1);
              pOVar20 = local_1a0;
LAB_0044eca2:
              pOVar12->id = pOVar9->id[1];
              iVar7 = pOVar9->end[1];
LAB_0044ecad:
              pOVar12->bRev = iVar7 != 0;
            }
          }
          else if (iVar8 == iVar1) {
            *(int *)(lVar21 + lVar17 * 4) = iVar8;
            *(int *)(*(long *)((long)local_198 + (long)pOVar9->id[0] * 8) + (long)pOVar9->end[0] * 4
                    ) = iVar8;
            pOVar20 = local_1a0;
          }
          else {
            this_02 = SegsArray.m_a + lVar22 + -1;
            local_190 = SegsArray.m_a + (long)iVar1 + -1;
            iVar2 = (SegsArray.m_a[(long)iVar1 + -1].m_a)->id;
            if ((SegsArray.m_a[lVar22 + -1].m_a)->id == EData.m_a[(int)local_1a4].id[0]) {
              if (iVar2 != iVar7) {
                lVar21 = 0;
                for (lVar17 = 0; lVar17 < pOVar10[lVar22 + -1].m_count; lVar17 = lVar17 + 1) {
                  pOVar11 = (OldCurveJoinSeg *)((long)&(pOVar10[lVar22 + -1].m_a)->id + lVar21);
                  piVar13 = *(int **)((long)pvVar3 +
                                     (long)*(int *)((long)&(pOVar10[lVar22 + -1].m_a)->id + lVar21)
                                     * 8);
                  if (0 < *piVar13) {
                    *piVar13 = iVar1;
                    piVar13 = *(int **)((long)pvVar3 + (long)pOVar11->id * 8);
                  }
                  if (0 < piVar13[1]) {
                    piVar13[1] = iVar1;
                  }
                  ON_SimpleArray<OldCurveJoinSeg>::Append(local_190,pOVar11);
                  lVar21 = lVar21 + 8;
                }
                *(int *)(*(long *)((long)pvVar3 + (long)pOVar9->id[1] * 8) +
                        (long)pOVar9->end[1] * 4) = iVar1;
                *(int *)(*(long *)((long)pvVar3 + (long)pOVar9->id[0] * 8) +
                        (long)pOVar9->end[0] * 4) = iVar1;
                pOVar20 = local_1a0;
                if (-1 < pOVar10[lVar22 + -1].m_capacity) {
                  pOVar10[lVar22 + -1].m_count = 0;
                }
                goto LAB_0044ea5f;
              }
              OldReverseSegs(this_02);
              lVar22 = 0;
              for (lVar21 = 0; lVar21 < pOVar10[(long)iVar1 + -1].m_count; lVar21 = lVar21 + 1) {
                pOVar11 = (OldCurveJoinSeg *)((long)&(pOVar10[(long)iVar1 + -1].m_a)->id + lVar22);
                piVar13 = *(int **)((long)local_198 +
                                   (long)*(int *)((long)&(pOVar10[(long)iVar1 + -1].m_a)->id +
                                                 lVar22) * 8);
                if (0 < *piVar13) {
                  *piVar13 = iVar8;
                  piVar13 = *(int **)((long)local_198 + (long)pOVar11->id * 8);
                }
                if (0 < piVar13[1]) {
                  piVar13[1] = iVar8;
                }
                ON_SimpleArray<OldCurveJoinSeg>::Append(this_02,pOVar11);
                lVar22 = lVar22 + 8;
              }
            }
            else if (iVar2 == iVar7) {
              lVar22 = 0;
              for (lVar21 = 0; lVar21 < pOVar10[(long)iVar1 + -1].m_count; lVar21 = lVar21 + 1) {
                pOVar11 = (OldCurveJoinSeg *)((long)&(pOVar10[(long)iVar1 + -1].m_a)->id + lVar22);
                piVar13 = *(int **)((long)local_198 +
                                   (long)*(int *)((long)&(pOVar10[(long)iVar1 + -1].m_a)->id +
                                                 lVar22) * 8);
                if (0 < *piVar13) {
                  *piVar13 = iVar8;
                  piVar13 = *(int **)((long)local_198 + (long)pOVar11->id * 8);
                }
                if (0 < piVar13[1]) {
                  piVar13[1] = iVar8;
                }
                ON_SimpleArray<OldCurveJoinSeg>::Append(this_02,pOVar11);
                lVar22 = lVar22 + 8;
              }
            }
            else {
              OldReverseSegs(local_190);
              lVar22 = 0;
              for (lVar21 = 0; lVar21 < pOVar10[(long)iVar1 + -1].m_count; lVar21 = lVar21 + 1) {
                pOVar11 = (OldCurveJoinSeg *)((long)&(pOVar10[(long)iVar1 + -1].m_a)->id + lVar22);
                piVar13 = *(int **)((long)local_198 +
                                   (long)*(int *)((long)&(pOVar10[(long)iVar1 + -1].m_a)->id +
                                                 lVar22) * 8);
                if (0 < *piVar13) {
                  *piVar13 = iVar8;
                  piVar13 = *(int **)((long)local_198 + (long)pOVar11->id * 8);
                }
                if (0 < piVar13[1]) {
                  piVar13[1] = iVar8;
                }
                ON_SimpleArray<OldCurveJoinSeg>::Append(this_02,pOVar11);
                lVar22 = lVar22 + 8;
              }
            }
            *(int *)(*(long *)((long)local_198 + (long)pOVar9->id[1] * 8) + (long)pOVar9->end[1] * 4
                    ) = iVar8;
            *(int *)(*(long *)((long)local_198 + (long)pOVar9->id[0] * 8) + (long)pOVar9->end[0] * 4
                    ) = iVar8;
            pOVar20 = local_1a0;
            if (-1 < pOVar10[(long)iVar1 + -1].m_capacity) {
              pOVar10[(long)iVar1 + -1].m_count = 0;
            }
          }
        }
      }
LAB_0044ea5f:
    }
    for (local_1a4 = 0; (int)local_1a4 < SegsArray.m_count; local_1a4 = local_1a4 + 1) {
      iVar7 = SegsArray.m_a[(int)local_1a4].m_count;
      if (1 < (long)iVar7) {
        pOVar10 = SegsArray.m_a + (int)local_1a4;
        if (!bPreserveDirection) {
          iVar8 = 0;
          for (lVar22 = 0; iVar7 != lVar22; lVar22 = lVar22 + 1) {
            iVar8 = iVar8 + (uint)pOVar10->m_a[lVar22].bRev;
          }
          if (iVar7 < iVar8 * 2) {
            OldReverseSegs(pOVar10);
          }
        }
        this = (OldCurveJoinSeg)operator_new(0x40);
        ON_PolyCurve::ON_PolyCurve((ON_PolyCurve *)this,pOVar10->m_count);
        lVar21 = 0;
        lVar22 = 1;
        local_17c = 0;
        local_190 = (ON_SimpleArray<OldCurveJoinSeg> *)CONCAT44(local_190._4_4_,0xffffffff);
LAB_0044eedd:
        if (lVar21 < pOVar10->m_count) {
          pOVar11 = pOVar10->m_a;
          if (local_1a0 != (ON_SimpleArray<int> *)0x0) {
            local_1a0->m_a[cmap.m_a[pOVar11[lVar21].id]] = OutCurves->m_count;
          }
          C_1 = IC.m_a[pOVar11[lVar21].id];
          iVar7 = pOVar10->m_a[lVar21].id;
          iVar8 = (int)local_190;
          if (iVar7 < (int)local_190 || (int)local_190 < 0) {
            local_17c = (int)lVar21;
            iVar8 = iVar7;
          }
          local_190 = (ON_SimpleArray<OldCurveJoinSeg> *)CONCAT44(local_190._4_4_,iVar8);
          if (pOVar10->m_a[lVar21].bRev != false) {
            (*(C_1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])();
          }
          iVar7 = ON_PolyCurve::Count((ON_PolyCurve *)this);
          pOVar14 = (ON_NurbsCurve *)C_1;
          if ((iVar7 == 0) ||
             (bVar5 = ON_ForceMatchCurveEnds((ON_Curve *)this,1,C_1,0),
             pOVar14 = (ON_NurbsCurve *)C_1, bVar5)) goto LAB_0044f0b1;
          ON_Curve::PointAtEnd((ON_3dPoint *)&Seg,(ON_Curve *)this);
          ON_Curve::PointAtStart(&Q,C_1);
          ON_3dPoint::operator+(&local_48,(ON_3dPoint *)&Seg,&Q);
          operator*(&local_a8,0.5,&local_48);
          Seg = (OldCurveJoinSeg)local_a8.x;
          cVar4 = (**(code **)(*(long *)this + 0x1d0))(this);
          if ((cVar4 != '\0') &&
             (iVar7 = (*(C_1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x39])(),
             pOVar14 = (ON_NurbsCurve *)C_1, (char)iVar7 != '\0')) goto LAB_0044f0b1;
          pOVar14 = ON_Curve::NurbsCurve(C_1,(ON_NurbsCurve *)0x0,0.0,(ON_Interval *)0x0);
          if (pOVar14 != (ON_NurbsCurve *)0x0) {
            iVar7 = (*(pOVar14->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                      [0x39])(pOVar14);
            if ((char)iVar7 != '\0') {
              if (C_1 != (ON_Curve *)0x0) {
                (*(C_1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
              }
              goto LAB_0044f0b1;
            }
            (*(pOVar14->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])
                      (pOVar14);
          }
          iVar7 = ON_PolyCurve::Count((ON_PolyCurve *)this);
          bVar5 = iVar7 != 0;
          if (bVar5) {
            local_a8.x = (double)this;
            ON_SimpleArray<ON_Curve_*>::Append(OutCurves,(ON_Curve **)&local_a8);
          }
          if (local_1a0 != (ON_SimpleArray<int> *)0x0) {
            local_1a0->m_a[cmap.m_a[pOVar10->m_a[lVar21].id]] =
                 local_1a0->m_a[cmap.m_a[pOVar10->m_a[lVar21].id]] + 1;
          }
          ON_SimpleArray<ON_Curve_*>::Append(OutCurves,&C_1);
          for (; (int)lVar22 < pOVar10->m_count; lVar22 = lVar22 + 1) {
            pOVar11 = pOVar10->m_a;
            if (local_1a0 != (ON_SimpleArray<int> *)0x0) {
              local_1a0->m_a[cmap.m_a[pOVar11[lVar22].id]] = OutCurves->m_count;
            }
            ON_SimpleArray<ON_Curve_*>::Append(OutCurves,IC.m_a + pOVar11[lVar22].id);
          }
        }
        else {
          bVar5 = false;
        }
        iVar7 = ON_PolyCurve::Count((ON_PolyCurve *)this);
        pOVar20 = local_1a0;
        if (iVar7 == 0) {
          (**(code **)(*(long *)this + 0x20))(this);
        }
        else if (!bVar5) {
          cVar4 = (**(code **)(*(long *)this + 0x1a0))(this);
          if (((cVar4 == '\0') &&
              (bVar5 = ON_Curve::IsClosable((ON_Curve *)this,join_tol,0.0,10.0), bVar5)) &&
             (bVar5 = ON_ForceMatchCurveEnds((ON_Curve *)this,0,(ON_Curve *)this,1), !bVar5)) {
            ON_Curve::PointAtStart(&local_78,(ON_Curve *)this);
            (**(code **)(*(long *)this + 0x1d0))(this);
          }
          bVar6 = (**(code **)(*(long *)this + 0x1a0))(this);
          if ((bVar6 & -1 < (int)local_190) == 1) {
            OVar23 = ON_PolyCurve::SegmentDomain((ON_PolyCurve *)this,local_17c);
            Seg = OVar23.m_t[0];
            pdVar16 = ON_Interval::operator[]((ON_Interval *)&Seg,0);
            (**(code **)(*(long *)this + 0x138))(SUB84(*pdVar16,0),this);
          }
          ON_PolyCurve::RemoveNesting((ON_PolyCurve *)this);
          ON_PolyCurve::SynchronizeSegmentDomains((ON_PolyCurve *)this);
          Seg = this;
          ON_SimpleArray<ON_Curve_*>::Append(OutCurves,(ON_Curve **)&Seg);
        }
      }
    }
    for (local_1a4 = 0; (int)local_1a4 < IC.m_count; local_1a4 = local_1a4 + 1) {
      piVar13 = *(int **)((long)local_198 + (long)(int)local_1a4 * 8);
      if ((*piVar13 == 0) && (piVar13[1] == 0)) {
        if (pOVar20 != (ON_SimpleArray<int> *)0x0) {
          pOVar20->m_a[cmap.m_a[(int)local_1a4]] = OutCurves->m_count;
        }
        ON_SimpleArray<ON_Curve_*>::Append(OutCurves,IC.m_a + (int)local_1a4);
      }
    }
    for (local_1a4 = 0; (int)local_1a4 < OutCurves->m_count; local_1a4 = local_1a4 + 1) {
      pOVar15 = OutCurves->m_a[(int)local_1a4];
      if (((pOVar15 != (ON_Curve *)0x0) &&
          (iVar7 = (*(pOVar15->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(pOVar15),
          (char)iVar7 == '\0')) && (bVar5 = ON_Curve::IsClosable(pOVar15,join_tol,0.0,10.0), bVar5))
      {
        ON_Curve::PointAtStart(&local_90,pOVar15);
        (*(pOVar15->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3a])(pOVar15);
      }
    }
    onfree(local_198);
    onfree(__s);
    iVar18 = OutCurves->m_count - iVar18;
    ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg>_>::~ON_ClassArray(&SegsArray);
    ON_SimpleArray<OldCurveJoinEndData>::~ON_SimpleArray(&EData);
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&End.super_ON_SimpleArray<ON_3dPoint>);
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&Start.super_ON_SimpleArray<ON_3dPoint>);
    ON_SimpleArray<int>::~ON_SimpleArray(&cmap);
    ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&IC);
  }
  return iVar18;
LAB_0044f0b1:
  C_1 = &pOVar14->super_ON_Curve;
  this_00 = ON_PolyCurve::Cast((ON_Object *)C_1);
  if (this_00 == (ON_PolyCurve *)0x0) {
    ON_PolyCurve::Append((ON_PolyCurve *)this,C_1);
  }
  else {
    for (iVar7 = 0; iVar8 = ON_PolyCurve::Count(this_00), iVar7 < iVar8; iVar7 = iVar7 + 1) {
      pOVar15 = ON_PolyCurve::SegmentCurve(this_00,iVar7);
      iVar8 = (*(pOVar15->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(pOVar15);
      if ((ON_Curve *)CONCAT44(extraout_var_00,iVar8) != (ON_Curve *)0x0) {
        ON_PolyCurve::Append((ON_PolyCurve *)this,(ON_Curve *)CONCAT44(extraout_var_00,iVar8));
      }
    }
    (*(this_00->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(this_00);
  }
  lVar21 = lVar21 + 1;
  lVar22 = lVar22 + 1;
  goto LAB_0044eedd;
}

Assistant:

int 
ON_JoinCurvesOld(const ON_SimpleArray<const ON_Curve*>& InCurves,
  ON_SimpleArray<ON_Curve*>& OutCurves,
  double join_tol,
  bool bPreserveDirection, // = false
  ON_SimpleArray<int>* key //=0
)

{

  int i, count = OutCurves.Count();
  if (InCurves.Count() < 1)
    return 0;

  int dim = InCurves[0]->Dimension();
  for (i=1; i<InCurves.Count(); i++){
    if (InCurves[i]->Dimension() != dim) return 0;
  }

  if (key) {
    key->Reserve(InCurves.Count());
    for (i=0; i<InCurves.Count(); i++) key->Append(-1);
  }

  //Copy curves, take out closed curves. 
  OutCurves.Reserve(InCurves.Count());
  ON_SimpleArray<ON_Curve*> IC(InCurves.Count());
  ON_SimpleArray<int> cmap(InCurves.Count());
  for (i=0; i<InCurves.Count(); i++){
    ON_Curve* C = InCurves[i]->DuplicateCurve();
    if (!C) continue;
    if (C->IsClosed()) {
      if (key) (*key)[i] = OutCurves.Count();
      OutCurves.Append(C);
    }
    else {
      cmap.Append(i);
      IC.Append(C);
    }
  }

  //IC is a list of copies of all open curves.  match endpoints and join into polycurves.
  //copy curves that are not joined.
  ON_3dPointArray Start(IC.Count());
  Start.SetCount(IC.Count());
  ON_3dPointArray End(IC.Count());
  End.SetCount(IC.Count());
  for (i=0; i<IC.Count(); i++){
    Start[i] = IC[i]->PointAtStart();
    End[i] = IC[i]->PointAtEnd();
  }

  //get a list of all possible joins
  ON_SimpleArray<OldCurveJoinEndData> EData(IC.Count());
  for (i=0; i<IC.Count(); i++){
    int j;
    for (j=0; j<IC.Count(); j++){
      if (i==j) continue;
      double dist = Start[i].DistanceTo(End[j]);
      if (dist <= join_tol){
        OldCurveJoinEndData& ED = EData.AppendNew();
        ED.id[0] = i;
        ED.end[0] = 0;
        ED.id[1] = j;
        ED.end[1] = 1;
        ED.dist = dist;
      }
      if (!bPreserveDirection && i<j){
        dist = Start[i].DistanceTo(Start[j]);
        if (dist <= join_tol){
          OldCurveJoinEndData& ED = EData.AppendNew();
          ED.id[0] = i;
          ED.end[0] = 0;
          ED.id[1] = j;
          ED.end[1] = 0;
          ED.dist = dist;
        }
        dist = End[i].DistanceTo(End[j]);
        if (dist <= join_tol){
          OldCurveJoinEndData& ED = EData.AppendNew();
          ED.id[0] = i;
          ED.end[0] = 1;
          ED.id[1] = j;
          ED.end[1] = 1;
          ED.dist = dist;
        }
      }
    }
  }

  //sort possibilities by distance
  EData.QuickSort(OldCompareEndData);

  int* endspace = (int*)onmalloc(2*sizeof(int)*IC.Count());
  memset(endspace, 0, 2*sizeof(int)*IC.Count());
  int** endarray = (int**)onmalloc(sizeof(int*)*IC.Count());

  //endarray[i] is an int[2].  if endarray[i][0] > 0, then IC[i] is part of
  //polycurve endarray[i][0] - 1, and the start of IC[i] is interior to the polycurve.
  //if endarray[i][1] > 0, then the end of IC[i] is interior.  if both endarray[i][0] > 0
  //and endarray[i][1] > 0, then they are equal.

  for (i=0; i<IC.Count(); i++)
    endarray[i] = &endspace[2*i];

  ON_ClassArray<ON_SimpleArray<OldCurveJoinSeg> > SegsArray(IC.Count());

  for (i=0; i<EData.Count(); i++){
    const OldCurveJoinEndData& ED = EData[i];
    if (endarray[ED.id[0]][ED.end[0]] > 0 || endarray[ED.id[1]][ED.end[1]] > 0)
      continue; //one of these endpoints has already been join to a closer end
    if (endarray[ED.id[0]][1 - ED.end[0]] == 0){
      if (endarray[ED.id[1]][1 - ED.end[1]] == 0){//new curve
        endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = SegsArray.Count()+1;
        ON_SimpleArray<OldCurveJoinSeg>& SArray = SegsArray.AppendNew();
        SArray.Reserve(4);
        OldCurveJoinSeg& Seg0 = SArray.AppendNew();
        OldCurveJoinSeg& Seg1 = SArray.AppendNew();
        if (ED.end[0]) {
          Seg0.id = ED.id[0];
          Seg0.bRev = false;
          Seg1.id = ED.id[1];
          Seg1.bRev = (ED.end[1]) ? true : false;
        }
        else {
          Seg1.id = ED.id[0];
          Seg1.bRev = false;
          Seg0.id = ED.id[1];
          Seg0.bRev = (ED.end[1]) ? false : true;
        }
      }

      else {

        //second curve is part of an existing sequence. Insert or append first curve.
        ON_SimpleArray<OldCurveJoinSeg>& SArray = SegsArray[endarray[ED.id[1]][1 - ED.end[1]] - 1];
        endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = 
          endarray[ED.id[1]][1 - ED.end[1]];

        if (SArray[0].id == ED.id[1]){
          OldCurveJoinSeg Seg;
          Seg.id = ED.id[0];
          Seg.bRev = (ED.end[0]) ? false : true;
          SArray.Insert(0, Seg);
        }
        else {
          OldCurveJoinSeg& Seg = SArray.AppendNew();
          Seg.id = ED.id[0];
          Seg.bRev = (ED.end[0]) ? true : false;
        }
      }
    }
    else if (endarray[ED.id[1]][1 - ED.end[1]] == 0){
      //first curve is part of an existing sequence. Insert or append second curve.
      ON_SimpleArray<OldCurveJoinSeg>& SArray = SegsArray[endarray[ED.id[0]][1 - ED.end[0]] - 1];
      endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = 
        endarray[ED.id[0]][1 - ED.end[0]];

      if (SArray[0].id == ED.id[0]){
        OldCurveJoinSeg Seg;
        Seg.id = ED.id[1];
        Seg.bRev = (ED.end[1]) ? false : true;
        SArray.Insert(0, Seg);
      }
      else {
        OldCurveJoinSeg& Seg = SArray.AppendNew();
        Seg.id = ED.id[1];
        Seg.bRev = (ED.end[1]) ? true : false;
      }
    }
    else {
      //both are in existing sequences.  join the sequences.
      if (endarray[ED.id[0]][1 - ED.end[0]] == endarray[ED.id[1]][1 - ED.end[1]])
        //closes off this curve
        endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = 
        endarray[ED.id[0]][1 - ED.end[0]];
      else {
        int segid0 = endarray[ED.id[0]][1 - ED.end[0]];
        int segid1 = endarray[ED.id[1]][1 - ED.end[1]];
        ON_SimpleArray<OldCurveJoinSeg>& SArray0 = SegsArray[segid0 - 1];
        ON_SimpleArray<OldCurveJoinSeg>& SArray1 = SegsArray[segid1 - 1];
        if (SArray0[0].id == ED.id[0]){
          if (SArray1[0].id == ED.id[1]){
            OldReverseSegs(SArray0);
            int j;
            for (j=0; j<SArray1.Count(); j++){
              if (endarray[SArray1[j].id][0] > 0) endarray[SArray1[j].id][0] = segid0;
              if (endarray[SArray1[j].id][1] > 0) endarray[SArray1[j].id][1] = segid0;
              SArray0.Append(SArray1[j]);
            }
            endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = segid0;
            SArray1.SetCount(0);
          }
          else {
            int j;
            for (j=0; j<SArray0.Count(); j++){
              if (endarray[SArray0[j].id][0] > 0) endarray[SArray0[j].id][0] = segid1;
              if (endarray[SArray0[j].id][1] > 0) endarray[SArray0[j].id][1] = segid1;
              SArray1.Append(SArray0[j]);
            }
            endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = segid1;
            SArray0.SetCount(0);
          }
        }
        else if (SArray1[0].id == ED.id[1]){
          int j;
          for (j=0; j<SArray1.Count(); j++){
            if (endarray[SArray1[j].id][0] > 0) endarray[SArray1[j].id][0] = segid0;
            if (endarray[SArray1[j].id][1] > 0) endarray[SArray1[j].id][1] = segid0;
            SArray0.Append(SArray1[j]);
          }
          endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = segid0;
          SArray1.SetCount(0);
        }
        else {
          OldReverseSegs(SArray1);
          int j;
          for (j=0; j<SArray1.Count(); j++) {
            if (endarray[SArray1[j].id][0] > 0) endarray[SArray1[j].id][0] = segid0;
            if (endarray[SArray1[j].id][1] > 0) endarray[SArray1[j].id][1] = segid0;
            SArray0.Append(SArray1[j]);
          }
          endarray[ED.id[0]][ED.end[0]] = endarray[ED.id[1]][ED.end[1]] = segid0;
          SArray1.SetCount(0);
        }
      }
    }
  }

  //make polycurves out of sequences

  for (i=0; i<SegsArray.Count(); i++){
    ON_SimpleArray<OldCurveJoinSeg>& SArray = SegsArray[i];
    if (SArray.Count() < 2) continue;
    if (!bPreserveDirection){//if number of reversed segs is more than half, reverse.
      int scount= 0;
      int j;
      for (j=0; j<SArray.Count(); j++) {
        if (SArray[j].bRev)
          scount++;
      }
      if (2*scount > SArray.Count())
        OldReverseSegs(SArray);
    }
    ON_PolyCurve* PC = new ON_PolyCurve(SArray.Count());
    bool pc_added = false;
    int j;
    int min_seg = 0;
    int min_id = -1;
    for (j=0; j<SArray.Count(); j++){
      if (key) 
        (*key)[cmap[SArray[j].id]] = OutCurves.Count();
      ON_Curve* C = IC[SArray[j].id];
      if (min_id < 0 || SArray[j].id < min_id){
        min_id = SArray[j].id;
        min_seg = j;
      }
      if (SArray[j].bRev) C->Reverse();
      if (PC->Count()){
        bool bSet = true;
        if (!ON_ForceMatchCurveEnds(*PC, 1, *C, 0)) {
          ON_3dPoint P = PC->PointAtEnd();
          ON_3dPoint Q = C->PointAtStart();
          P = 0.5*(P+Q);
          if (!PC->SetEndPoint(P) || !C->SetStartPoint(P)) {
            ON_NurbsCurve* NC = C->NurbsCurve();
            if (NC && NC->SetStartPoint(P)){
              delete C;
              C = NC;
            }
            else {
              bSet = false;
              delete NC;
              if (PC->Count()) {
                pc_added = true;
                OutCurves.Append(PC);
              }
              if (key)
                (*key)[cmap[SArray[j].id]]++;
              OutCurves.Append(C);
              int k;
              for (k=j+1; k<SArray.Count(); k++){
                if (key)
                  (*key)[cmap[SArray[k].id]] = OutCurves.Count();
                OutCurves.Append(IC[SArray[k].id]);
              }
              break;
            }
          }
        }
      }
      ON_PolyCurve* pPoly = ON_PolyCurve::Cast(C);
      if( pPoly){
        int si;
        for (si=0; si<pPoly->Count(); si++){
          const ON_Curve* SC = pPoly->SegmentCurve(si);
          ON_Curve* SCCopy = SC->DuplicateCurve();
          if (SCCopy) PC->Append(SCCopy);
        }
        delete pPoly;
      }
      else PC->Append(C);
    }
    if (!PC->Count()) delete PC;
    else if (!pc_added) {
      if (!PC->IsClosed() && PC->IsClosable(join_tol)){
        if (!ON_ForceMatchCurveEnds(*PC, 0, *PC, 1))
          PC->SetEndPoint(PC->PointAtStart());
      }
      if (PC->IsClosed() && min_id >= 0){
        //int sc = PC->SpanCount();
        double t = PC->SegmentDomain(min_seg)[0];
        PC->ChangeClosedCurveSeam(t);
      }

      // 28 October 2010 Dale Lear
      //    I added the RemoveNesting() and SynchronizeSegmentDomains()
      //    lines so Rhino will create higher quality geometry.
      PC->RemoveNesting();
      PC->SynchronizeSegmentDomains();

      OutCurves.Append(PC);
    }
  }

  //add in singletons
  for (i=0; i<IC.Count(); i++){
    if (endarray[i][0] == 0 && endarray[i][1] == 0){
      if (key) (*key)[cmap[i]] = OutCurves.Count();
      OutCurves.Append(IC[i]);
    }
  }

  /* This was added by greg to fix big curves that are nearly, but not quite, closed.
  It causes problems when the curve is tiny.
  for(i=0; i<OutCurves.Count(); i++){
  if(!OutCurves[i]->IsClosed()){
  ON_3dPoint s= OutCurves[i]->PointAtStart();
  ON_3dPoint e = OutCurves[i]->PointAtEnd();
  if(s.DistanceTo(e)<join_tol)
  OutCurves[i]->SetEndPoint( s );			
  }
  }
  */

  //Chuck added this, 1/16/03.
  for(i=0; i<OutCurves.Count(); i++){
    ON_Curve* C = OutCurves[i];
    if (!C || C->IsClosed()) continue;
    if (C->IsClosable(join_tol))
      C->SetEndPoint(C->PointAtStart());
  }

  onfree((void*)endarray);
  onfree((void*)endspace);

  return OutCurves.Count() - count;
}